

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
UniQueue<FileTarget>::emplace_back<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
          (UniQueue<FileTarget> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_1,PackFormat *s_2)

{
  reference pFVar1;
  pair<std::_Rb_tree_const_iterator<FileTarget>,_bool> pVar2;
  pair<std::_Rb_tree_const_iterator<FileTarget>,_bool> local_118;
  _Base_ptr local_108;
  _Base_ptr local_100;
  iterator local_f8;
  const_iterator local_d8;
  _Map_pointer *local_b8;
  iterator local_b0;
  iterator local_90;
  undefined1 local_70 [8];
  _Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
  it;
  KEY key;
  undefined1 local_38 [8];
  pair<std::_Rb_tree_const_iterator<FileTarget>,_bool> r;
  PackFormat *s_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  UniQueue<FileTarget> *this_local;
  
  r._8_8_ = s_2;
  if ((this->dirty & 1U) != 0) {
    cleanup(this,(EVP_PKEY_CTX *)s);
  }
  pVar2 = std::set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>>::
          emplace<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
                    ((set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>> *)
                     &this->unique,s,s_1,(PackFormat *)r._8_8_);
  local_38 = (undefined1  [8])pVar2.first._M_node;
  r.first._M_node._0_1_ = pVar2.second;
  pFVar1 = std::_Rb_tree_const_iterator<FileTarget>::operator*
                     ((_Rb_tree_const_iterator<FileTarget> *)local_38);
  it._M_node = (_Map_pointer)std::cref<FileTarget>(pFVar1);
  if (((byte)r.first._M_node & 1) == 0) {
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::begin(&local_90,
            &this->
             super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
           );
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::end(&local_b0,
          &this->
           super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
         );
    local_b8 = &it._M_node;
    std::
    find_if<std::_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>&,std::reference_wrapper<FileTarget_const>*>,UniQueue<FileTarget>::emplace_back<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>(std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&)::_lambda(std::reference_wrapper<FileTarget_const>const&)_1_>
              ((_Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
                *)local_70,&local_90,&local_b0,(anon_class_8_1_ba1d59bf_for__M_pred)local_b8);
    std::
    _Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>const&,std::reference_wrapper<FileTarget_const>const*>
    ::
    _Deque_iterator<std::_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>&,std::reference_wrapper<FileTarget_const>*>,void>
              ((_Deque_iterator<std::reference_wrapper<FileTarget_const>,std::reference_wrapper<FileTarget_const>const&,std::reference_wrapper<FileTarget_const>const*>
                *)&local_d8,
               (_Deque_iterator<std::reference_wrapper<const_FileTarget>,_std::reference_wrapper<const_FileTarget>_&,_std::reference_wrapper<const_FileTarget>_*>
                *)local_70);
    std::
    deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
    ::erase(&local_f8,
            &this->
             super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
            ,&local_d8);
    local_100 = (_Base_ptr)local_38;
    local_108 = (_Base_ptr)
                std::set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>>::
                erase_abi_cxx11_((set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>> *
                                 )&this->unique,(const_iterator)local_38);
    pVar2 = std::set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>>::
            emplace<std::__cxx11::string_const&,std::__cxx11::string&,PackFormat&>
                      ((set<FileTarget,std::less<FileTarget>,std::allocator<FileTarget>> *)
                       &this->unique,s,s_1,(PackFormat *)r._8_8_);
    local_118.first = pVar2.first._M_node;
    local_118.second = pVar2.second;
    std::pair<std::_Rb_tree_const_iterator<FileTarget>,_bool>::operator=
              ((pair<std::_Rb_tree_const_iterator<FileTarget>,_bool> *)local_38,&local_118);
    pFVar1 = std::_Rb_tree_const_iterator<FileTarget>::operator*
                       ((_Rb_tree_const_iterator<FileTarget> *)local_38);
    it._M_node = (_Map_pointer)std::cref<FileTarget>(pFVar1);
  }
  std::
  deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
  ::push_back(&this->
               super_deque<std::reference_wrapper<const_FileTarget>,_std::allocator<std::reference_wrapper<const_FileTarget>_>_>
              ,(value_type *)&it._M_node);
  return;
}

Assistant:

void emplace_back(S&&... s)
    {
        if (dirty)
            cleanup();
        auto r = unique.emplace(std::forward<S>(s)...);
        KEY key = std::cref(*r.first);
        if (!r.second) { // If already present we must remove the prevous one in
                         // the deck
            auto it = std::find_if(
                PARENT::begin(), PARENT::end(),
                [&](const KEY& k) -> bool { return key.get() == k.get(); });
            PARENT::erase(it);
            unique.erase(r.first);
            r = unique.emplace(std::forward<S>(s)...);
            key = std::cref(*r.first);
        }
        PARENT::push_back(key);
    }